

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

QString * funcSig(Command *c,char *className)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  TypedName *s_00;
  char *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  TypedName *a;
  QList<VkSpecParser::TypedName> *__range2;
  bool first;
  QString *s;
  char16_t *str;
  const_iterator __end2;
  const_iterator __begin2;
  DataPointer *in_stack_fffffffffffffe68;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  QChar c_00;
  QString *in_stack_fffffffffffffe88;
  char *local_160;
  QChar local_f2 [28];
  QChar local_ba [13];
  char local_a0 [24];
  QArrayDataPointer<char16_t> local_88 [2];
  TypedName *local_58;
  const_iterator local_50;
  const_iterator local_48;
  QChar local_3a [25];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QtPrivate::asString(in_RSI + 1);
  QString::toLocal8Bit(in_stack_fffffffffffffe88);
  pcVar4 = QByteArray::constData((QByteArray *)0x10541b);
  local_160 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_160 = "";
  }
  pcVar5 = "";
  if (in_RDX != (char *)0x0) {
    pcVar5 = "::";
  }
  QtPrivate::asString(in_RSI);
  QString::toLocal8Bit(in_stack_fffffffffffffe88);
  pcVar6 = QByteArray::constData((QByteArray *)0x105493);
  QString::asprintf((char *)in_RDI,"%s %s%s%s",pcVar4,local_160,pcVar5,pcVar6);
  QByteArray::~QByteArray((QByteArray *)0x1054c5);
  QByteArray::~QByteArray((QByteArray *)0x1054d2);
  bVar1 = QList<VkSpecParser::TypedName>::isEmpty((QList<VkSpecParser::TypedName> *)0x1054e0);
  if (!bVar1) {
    QChar::QChar<char16_t,_true>(local_3a,L'(');
    QString::operator+=((QString *)in_stack_fffffffffffffe70,
                        (QChar)(char16_t)((ulong)in_stack_fffffffffffffe78 >> 0x30));
    bVar1 = true;
    local_48.i = (TypedName *)0xaaaaaaaaaaaaaaaa;
    local_48 = QList<VkSpecParser::TypedName>::begin
                         ((QList<VkSpecParser::TypedName> *)in_stack_fffffffffffffe70);
    local_50.i = (TypedName *)0xaaaaaaaaaaaaaaaa;
    local_50 = QList<VkSpecParser::TypedName>::end
                         ((QList<VkSpecParser::TypedName> *)in_stack_fffffffffffffe70);
    while( true ) {
      c_00.ucs = (char16_t)((ulong)in_stack_fffffffffffffe78 >> 0x30);
      local_58 = local_50.i;
      bVar2 = QList<VkSpecParser::TypedName>::const_iterator::operator!=(&local_48,local_50);
      if (!bVar2) break;
      s_00 = QList<VkSpecParser::TypedName>::const_iterator::operator*(&local_48);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_88,(Data *)0x0,L", ",2);
        QString::QString((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        QString::operator+=((QString *)in_stack_fffffffffffffe70,
                            (QString *)in_stack_fffffffffffffe68);
        QString::~QString((QString *)0x10564b);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe70);
      }
      QtPrivate::asString(&s_00->type);
      QString::toLocal8Bit(in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe78 = QByteArray::constData((QByteArray *)0x10568a);
      in_stack_fffffffffffffe70 = &(s_00->type).d;
      QChar::QChar<char16_t,_true>(local_ba,L'*');
      bVar3 = QString::endsWith((QChar)(char16_t)in_stack_fffffffffffffe70,
                                (uint)(ushort)local_ba[0].ucs);
      pcVar4 = " ";
      if ((bVar3 & 1) != 0) {
        pcVar4 = "";
      }
      QtPrivate::asString(&s_00->name);
      QString::toLocal8Bit(in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe88 = (QString *)QByteArray::constData((QByteArray *)0x105709);
      QtPrivate::asString(&s_00->typeSuffix);
      QString::toLocal8Bit(in_stack_fffffffffffffe88);
      pcVar5 = QByteArray::constData((QByteArray *)0x105739);
      QString::asprintf(local_a0,"%s%s%s%s",in_stack_fffffffffffffe78,pcVar4,
                        in_stack_fffffffffffffe88,pcVar5);
      QString::operator+=((QString *)in_stack_fffffffffffffe70,(QString *)in_stack_fffffffffffffe68)
      ;
      QString::~QString((QString *)0x105780);
      QByteArray::~QByteArray((QByteArray *)0x10578d);
      QByteArray::~QByteArray((QByteArray *)0x10579a);
      QByteArray::~QByteArray((QByteArray *)0x1057a7);
      QList<VkSpecParser::TypedName>::const_iterator::operator++(&local_48);
    }
    QChar::QChar<char16_t,_true>(local_f2,L')');
    QString::operator+=((QString *)in_stack_fffffffffffffe70,c_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString funcSig(const VkSpecParser::Command &c, const char *className = nullptr)
{
    QString s(QString::asprintf("%s %s%s%s", qPrintable(c.cmd.type),
                                (className ? className : ""), (className ? "::" : ""),
                                qPrintable(c.cmd.name)));
    if (!c.args.isEmpty()) {
        s += u'(';
        bool first = true;
        for (const VkSpecParser::TypedName &a : c.args) {
            if (!first)
                s += QStringLiteral(", ");
            else
                first = false;
            s += QString::asprintf("%s%s%s%s", qPrintable(a.type),
                                   (a.type.endsWith(u'*') ? "" : " "),
                                   qPrintable(a.name), qPrintable(a.typeSuffix));
        }
        s += u')';
    }
    return s;
}